

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publication.h
# Opt level: O2

int64_t __thiscall
aeron::Publication::newPosition
          (Publication *this,int32_t termCount,int32_t termOffset,int32_t termId,int64_t position,
          int32_t resultingOffset)

{
  if (0 < resultingOffset) {
    return (ulong)(uint)resultingOffset + (position - termOffset);
  }
  if (this->m_maxPossiblePosition < termOffset + position) {
    return -5;
  }
  concurrent::logbuffer::LogBufferDescriptor::rotateLog(this->m_logMetaDataBuffer,termCount,termId);
  return -3;
}

Assistant:

inline std::int64_t newPosition(
        std::int32_t termCount,
        std::int32_t termOffset,
        std::int32_t termId,
        std::int64_t position,
        std::int32_t resultingOffset)
    {
        if (resultingOffset > 0)
        {
            return (position - termOffset) + resultingOffset;
        }

        if ((position + termOffset) > m_maxPossiblePosition)
        {
            return MAX_POSITION_EXCEEDED;
        }

        LogBufferDescriptor::rotateLog(m_logMetaDataBuffer, termCount, termId);

        return ADMIN_ACTION;
    }